

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Sim3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Ssw_RarPars_t Pars;
  
  Ssw_RarSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_00241b2e:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FWBRSNTGgvh");
    iVar2 = globalUtilOptind;
    switch(iVar1) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_00241d1e:
        Abc_Print(-1,pcVar3);
        goto switchD_00241b7e_caseD_4f;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRandSeed = iVar1;
      break;
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x55:
    case 0x56:
      goto switchD_00241b7e_caseD_4f;
    case 0x52:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_00241d1e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRounds = iVar1;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00241d1e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRestart = iVar1;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_00241d1e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.TimeOut = iVar1;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_00241d1e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWords = iVar1;
      break;
    default:
      if (iVar1 == 0x42) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-B\" should be followed by an integer.\n";
          goto LAB_00241d1e;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nBinSize = iVar1;
      }
      else if (iVar1 == 0x46) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_00241d1e;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nFrames = iVar1;
      }
      else {
        if (iVar1 != 0x47) {
          if (iVar1 == 0x67) {
            Pars.fUseFfGrouping = Pars.fUseFfGrouping ^ 1;
          }
          else {
            if (iVar1 != 0x76) {
              if (iVar1 == -1) {
                p = pAbc->pGia;
                if (p != (Gia_Man_t *)0x0) {
                  if (p->nRegs != 0) {
                    iVar2 = Ssw_RarSimulateGia(p,&Pars);
                    pAbc->Status = iVar2;
                    Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
                    return 0;
                  }
                  Abc_Print(-1,
                            "Abc_CommandAbc9Sim3(): This command works only for sequential AIGs.\n")
                  ;
                  return 0;
                }
                pcVar3 = "Abc_CommandAbc9Sim3(): There is no AIG.\n";
                iVar2 = -1;
                goto LAB_00241e26;
              }
              goto switchD_00241b7e_caseD_4f;
            }
            Pars.fVerbose = Pars.fVerbose ^ 1;
          }
          goto LAB_00241b2e;
        }
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-G\" should be followed by an integer.\n";
          goto LAB_00241d1e;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.TimeOutGap = iVar1;
      }
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_00241b7e_caseD_4f:
      iVar2 = -2;
      Abc_Print(-2,"usage: &sim3 [-FWBRNT num] [-gvh]\n");
      Abc_Print(-2,"\t         performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-B num : the number of flops in one bin [default = %d]\n",
                (ulong)(uint)Pars.nBinSize);
      Abc_Print(-2,"\t-R num : the number of simulation rounds [default = %d]\n",
                (ulong)(uint)Pars.nRounds);
      Abc_Print(-2,"\t-S num : the number of rounds before a restart [default = %d]\n",
                (ulong)(uint)Pars.nRestart);
      Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
                (ulong)(uint)Pars.nRandSeed);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)Pars.TimeOut);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (Pars.fUseFfGrouping == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-g     : toggle heuristic flop grouping [default = %s]\n",pcVar3);
      if (Pars.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_00241e26:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sim3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Ssw_RarSimulateGia( Gia_Man_t * p, Ssw_RarPars_t * pPars );
    Ssw_RarPars_t Pars, * pPars = &Pars;
    int c;
    Ssw_RarSetDefaultParams( pPars );
    // parse command line
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWBRSNTGgvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBinSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBinSize < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestart < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap < 0 )
                goto usage;
            break;
        case 'g':
            pPars->fUseFfGrouping ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sim3(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sim3(): This command works only for sequential AIGs.\n" );
        return 0;
    }
    pAbc->Status = Ssw_RarSimulateGia( pAbc->pGia, pPars );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim3 [-FWBRNT num] [-gvh]\n" );
    Abc_Print( -2, "\t         performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n",       pPars->nFrames );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n",        pPars->nWords );
    Abc_Print( -2, "\t-B num : the number of flops in one bin [default = %d]\n",         pPars->nBinSize );
    Abc_Print( -2, "\t-R num : the number of simulation rounds [default = %d]\n",        pPars->nRounds );
    Abc_Print( -2, "\t-S num : the number of rounds before a restart [default = %d]\n",  pPars->nRestart );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",  pPars->nRandSeed );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n",   pPars->TimeOut );
    Abc_Print( -2, "\t-g     : toggle heuristic flop grouping [default = %s]\n",    pPars->fUseFfGrouping? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",    pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}